

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void __thiscall TestMaterial::initializeUniverse(TestMaterial *this)

{
  double dVar1;
  S_Box *pSVar2;
  S_Sphere *pSVar3;
  S_Superellipsoid *pSVar4;
  S_Point *this_00;
  void *pvVar5;
  S_Cone *this_01;
  ostream *poVar6;
  STP_BV *pSVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  undefined1 local_d8 [16];
  double local_c8;
  double local_b0 [5];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (this->nonSTPBV_ == true) {
    pSVar2 = (S_Box *)operator_new(0xa8);
    sch::S_Box::S_Box(pSVar2,0.2,0.2,0.2);
    sch::CD_Scene::addObject((S_Object *)this);
    pSVar2 = (S_Box *)operator_new(0xa8);
    sch::S_Box::S_Box(pSVar2,0.2,0.2,0.2);
    sch::CD_Scene::addObject((S_Object *)this);
    pSVar3 = (S_Sphere *)operator_new(0x98);
    local_d8._0_8_ = 0.1;
    sch::S_Sphere::S_Sphere(pSVar3,(double *)local_d8);
    sch::CD_Scene::addObject((S_Object *)this);
    pSVar3 = (S_Sphere *)operator_new(0x98);
    local_d8._0_8_ = 0.12;
    sch::S_Sphere::S_Sphere(pSVar3,(double *)local_d8);
    sch::CD_Scene::addObject((S_Object *)this);
    pSVar4 = (S_Superellipsoid *)operator_new(0xd8);
    sch::S_Superellipsoid::S_Superellipsoid(pSVar4,0.25,0.3,0.3,0.9,0.2);
    sch::CD_Scene::addObject((S_Object *)this);
    pSVar4 = (S_Superellipsoid *)operator_new(0xd8);
    sch::S_Superellipsoid::S_Superellipsoid(pSVar4,0.11,0.3,0.14,0.4,0.8);
    sch::CD_Scene::addObject((S_Object *)this);
    this_00 = (S_Point *)operator_new(0x98);
    sch::S_Point::S_Point(this_00);
    sch::CD_Scene::addObject((S_Object *)this);
    pvVar5 = operator_new(200);
    local_48 = 0x3fb999999999999a;
    uStack_40 = 0x3fb999999999999a;
    local_38 = 0x3fb999999999999a;
    local_68 = 0xbfb999999999999a;
    uStack_60 = 0xbfb999999999999a;
    local_58 = 0xbfb999999999999a;
    sch::S_Capsule::S_Capsule((S_Capsule *)0x9999999a,pvVar5);
    sch::CD_Scene::addObject((S_Object *)this);
    this_01 = (S_Cone *)operator_new(0xb0);
    local_d8._0_8_ = 0x3fe0000000000000;
    local_b0[0] = 0.3;
    sch::S_Cone::S_Cone(this_01,(double *)local_d8,local_b0);
    sch::CD_Scene::addObject((S_Object *)this);
    pvVar5 = operator_new(0xe0);
    local_88 = 0x3fb999999999999a;
    uStack_80 = 0x3fb999999999999a;
    local_78 = 0x3fb999999999999a;
    local_b0[1] = -0.1;
    local_b0[2] = -0.1;
    local_b0[3] = -0.1;
    sch::S_Cylinder::S_Cylinder((S_Cylinder *)0x9999999a,pvVar5);
    sch::CD_Scene::addObject((S_Object *)this);
    poVar6 = std::operator<<((ostream *)&std::cout,"10 Non-STP BV Objects added to scene");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  pSVar7 = (STP_BV *)operator_new(0xe8);
  sch::STP_BV::STP_BV(pSVar7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"sample_stpbv1.txt",(allocator<char> *)local_b0);
  (**(code **)(*(long *)pSVar7 + 0x48))(pSVar7,local_d8);
  std::__cxx11::string::~string((string *)local_d8);
  sch::CD_Scene::addObject((S_Object *)this);
  pSVar7 = (STP_BV *)operator_new(0xe8);
  sch::STP_BV::STP_BV(pSVar7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"sample_stpbv2.txt",(allocator<char> *)local_b0);
  (**(code **)(*(long *)pSVar7 + 0x48))(pSVar7,local_d8);
  std::__cxx11::string::~string((string *)local_d8);
  sch::CD_Scene::addObject((S_Object *)this);
  poVar6 = std::operator<<((ostream *)&std::cout,"2 STP-BVs loaded and added to the scene");
  std::endl<char,std::char_traits<char>>(poVar6);
  lVar11 = -2;
  lVar9 = -3;
  uVar12 = 0;
  uVar10 = 0;
  uVar8 = 0;
  while( true ) {
    if ((ulong)(*(long *)&this->field_0x10 - *(long *)&this->field_0x8 >> 3) <= uVar8) break;
    dVar1 = (double)(long)(lVar9 + (uVar12 / 6) * -6) * 0.8333333333333334 * 0.2;
    local_d8._8_4_ = SUB84(dVar1,0);
    local_d8._0_8_ = (double)(long)(lVar11 + (uVar10 / 5) * -5) * 0.2;
    local_d8._12_4_ = (int)((ulong)dVar1 >> 0x20);
    local_c8 = (double)(long)(lVar9 + (uVar12 / 7) * -7) * 0.7142857142857143 * 0.2;
    sch::S_Object::setPosition(*(Vector3T **)(*(long *)&this->field_0x8 + uVar8 * 8));
    uVar8 = uVar8 + 1;
    lVar11 = lVar11 + 7;
    uVar10 = uVar10 + 7;
    lVar9 = lVar9 + 5;
    uVar12 = uVar12 + 5;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"A total of ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," objects in the scene");
  std::endl<char,std::char_traits<char>>(poVar6);
  sch::CD_Scene::sceneProximityQuery();
  return;
}

Assistant:

void TestMaterial::initializeUniverse()
{
  if (nonSTPBV_)
  {
    sObj.addObject(new S_Box(0.2,0.2,0.2));
    sObj.addObject(new S_Box(0.2,0.2,0.2));
    sObj.addObject(new S_Sphere(0.1));
    sObj.addObject(new S_Sphere(0.12));

    sObj.addObject(new S_Superellipsoid(.25,.30,.30,0.9,0.2));
    sObj.addObject(new S_Superellipsoid(.11,.30,.14,0.4,0.8));
    sObj.addObject(new S_Point());
    sObj.addObject(new S_Capsule(Point3(0.1,0.1,0.1),Point3(-0.1,-0.1,-0.1),0.2));
    sObj.addObject(new S_Cone(0.5,0.3));
    sObj.addObject(new S_Cylinder(Point3(0.1,0.1,0.1),Point3(-0.1,-0.1,-0.1),0.2));

    std::cout << "10 Non-STP BV Objects added to scene" << std::endl;
  }

#ifdef MULTI_OBJECTS_TEST
  {
    bool b=true;
    int i=0;
    do
    {
      std::string s;
      s="";
      std::stringstream istr;
      istr<<std::string("C:/Mehdi/nuage_points/simplifies/testspace/jobj(")<<i<<").txt";


      getline(istr,s);
      std::fstream testfile;
      testfile.open(s.c_str());

      if (testfile.is_open())
      {
        b=true;
        testfile.close();

        //STP_BV stp;
        STP_BV_P stp;
        stp.constructFromFileWithGL(s.c_str());

        stppObjects.push_back(stp);
        //  stpObjects.push_back(stp);
      }
      else
        b=false;

      i++;

      //if (i==8) b=false;


    }
    while(b);

    for (int j=0; j<stppObjects.size(); j++)
    {
      sObj.addObject(&(stppObjects[j]));
    }

    std::cout << "Multi Object loaded and added to the scene" << std::endl;
  }
#else
  {
    STP_BV* s1 = new STP_BV();
    s1->constructFromFileWithGL("sample_stpbv1.txt");
    sObj.addObject(s1);

    STP_BV* s2 = new STP_BV();
    s2->constructFromFileWithGL("sample_stpbv2.txt");
    sObj.addObject(s2);
    std::cout << "2 STP-BVs loaded and added to the scene" << std::endl;
  }
#endif
  for (size_t i=0; i<sObj.size(); i++)
  {
    Vector3 position(
      Scalar(7*i%5)-2.,
      (Scalar(5*i%6)-3.)*(5.0/6.),
      (Scalar(5*i%7)-3.)*(5.0/7.)
    );
    position *= DispersionScale;
    sObj[i]->setPosition(position);
  }

  std::cout << "A total of "<< sObj.size() <<" objects in the scene"<<std::endl;

  DoTest();
}